

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  mfb_update_state mVar2;
  uint uVar3;
  mfb_window *window;
  uint uVar4;
  long lVar5;
  Events e;
  
  window = mfb_open_ex("Input Events CPP Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    lVar5 = 0;
    mfb_set_active_callback<Events>(window,&e,0x102676);
    mfb_set_resize_callback<Events>(window,&e,0x1026fc);
    mfb_set_keyboard_callback<Events>(window,&e,0x1027e4);
    mfb_set_char_input_callback<Events>(window,&e,0x1028be);
    mfb_set_mouse_button_callback<Events>(window,&e,0x102946);
    mfb_set_mouse_move_callback<Events>(window,&e,0x1029e0);
    mfb_set_mouse_scroll_callback<Events>(window,&e,0x102a32);
    mfb_set_user_data(window,"Input Events CPP Test");
    uVar4 = 0xbeef;
    do {
      for (; lVar5 != 480000; lVar5 = lVar5 + 1) {
        uVar3 = (int)uVar4 >> 3 ^ uVar4;
        uVar4 = (int)uVar4 >> 1 | (uVar3 & 1) << 0x1e;
        g_buffer[lVar5] = (uVar3 >> 1 & 0xff) * 0x10101;
      }
      mVar2 = mfb_update(window,g_buffer);
      if (mVar2 != STATE_OK) {
        return 0;
      }
      _Var1 = mfb_wait_sync(window);
      lVar5 = 0;
    } while (_Var1);
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_btn);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_RGB(noise, noise, noise); 
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}